

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O0

int __thiscall ReadData::ReadHead(ReadData *this,FILE *file,uchar *buff)

{
  int iVar1;
  uint uVar2;
  ostream *this_00;
  size_t sVar3;
  char local_2b;
  char local_2a;
  char local_29;
  int HeadLength;
  uchar HeadFlag [3];
  uchar *buff_local;
  FILE *file_local;
  ReadData *this_local;
  
  _HeadLength = buff;
  if (file == (FILE *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"open error");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 7;
  }
  else {
    while (iVar1 = feof((FILE *)file), iVar1 == 0) {
      sVar3 = fread(&local_29,1,1,(FILE *)file);
      if (sVar3 == 0) {
        return 2;
      }
      if (((local_2b == -0x56) && (local_2a == 'D')) && (local_29 == '\x12')) {
        sVar3 = fread(_HeadLength,0x19,1,(FILE *)file);
        if (sVar3 == 0) {
          return 2;
        }
        U2I(_HeadLength + 3,1);
        iVar1 = U2I(_HeadLength + 1,2);
        (this->Head).MessageID = iVar1;
        iVar1 = U2I(_HeadLength + 5,2);
        (this->Head).MessageLength = iVar1;
        iVar1 = U2I(_HeadLength + 10,1);
        (this->Head).TimeStatus = iVar1;
        if ((this->Head).MessageID == 0x2b) {
          iVar1 = U2I(_HeadLength + 0xb,2);
          (this->Head).GPST.Week = iVar1;
          iVar1 = U2I(_HeadLength + 0xd,4);
          (this->Head).GPST.SOW = (double)iVar1 / 1000.0;
        }
        uVar2 = U2I(_HeadLength + 0x11,4);
        (this->Head).HealthFlag = uVar2 & 1;
        break;
      }
      local_2b = local_2a;
      local_2a = local_29;
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ReadData::ReadHead(FILE* file, unsigned char* buff)
{
    if(file == NULL)
    {
        cout << "open error" << endl;
        return OPEN_ERROR;
    }

    unsigned char HeadFlag[3];
    while(!feof(file))
    {
        if(!fread(&HeadFlag[2], 1, 1, file))
            return FILE_OR_BUFF_END;

        if(HeadFlag[0] != 0xaa || HeadFlag[1] != 0x44 || HeadFlag[2] != 0x12)
        {
            HeadFlag[0] = HeadFlag[1];
            HeadFlag[1] = HeadFlag[2];
            continue;
        }
        if(!fread(buff, 25, 1, file))
            return FILE_OR_BUFF_END;
        int HeadLength = U2I((buff + 3), 1);
        try
        {
            this->Head.MessageID = U2I((buff + 1), 2);
            this->Head.MessageLength = U2I((buff + 5), 2);
            this->Head.TimeStatus = U2I((buff + 10), 1);
            if(this->Head.MessageID == 43)
            {
                this->Head.GPST.Week = U2I((buff + 11), 2);
                this->Head.GPST.SOW = U2I((buff + 13), 4) / 1000.0;
            }
            this->Head.HealthFlag = (U2I((buff + 17), 4) & 1);
        }
        catch(...)
        {
            cout << "error happened when reading head" << endl;
            return UNKNOWN_ERROR;
        }
        break;
    }
    
    return 0;
}